

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaBlockVector::PrintDetailedMap(VmaBlockVector *this,VmaJsonWriter *json)

{
  VmaBlockMetadata *pVVar1;
  size_t sVar2;
  VmaDeviceMemoryBlock **ppVVar3;
  VmaJsonWriter *in_RSI;
  long in_RDI;
  size_t i;
  VmaMutexLockRead lock;
  undefined4 in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  VmaJsonWriter *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  undefined1 singleLine;
  VmaJsonWriter *in_stack_ffffffffffffff90;
  size_t local_30;
  
  VmaMutexLockRead::VmaMutexLockRead
            ((VmaMutexLockRead *)in_stack_ffffffffffffff90,
             (VmaRWMutex *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0));
  VmaJsonWriter::BeginObject(in_stack_ffffffffffffff90,SUB41(in_stack_ffffffffffffff8c >> 0x18,0));
  local_30 = 0;
  while( true ) {
    singleLine = (undefined1)(in_stack_ffffffffffffff8c >> 0x18);
    sVar2 = VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::size
                      ((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>
                        *)(in_RDI + 0x90));
    if (sVar2 <= local_30) break;
    VmaJsonWriter::BeginString
              (in_stack_ffffffffffffff80,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    ppVVar3 = VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::
              operator[]((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>
                          *)(in_RDI + 0x90),local_30);
    VmaDeviceMemoryBlock::GetId(*ppVVar3);
    VmaJsonWriter::ContinueString(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    VmaJsonWriter::EndString
              (in_stack_ffffffffffffff80,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    VmaJsonWriter::BeginObject(in_stack_ffffffffffffff90,(bool)singleLine);
    VmaJsonWriter::WriteString
              (in_stack_ffffffffffffff80,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    in_stack_ffffffffffffff90 = in_RSI;
    ppVVar3 = VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::
              operator[]((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>
                          *)(in_RDI + 0x90),local_30);
    in_stack_ffffffffffffff8c = VmaDeviceMemoryBlock::GetMapRefCount(*ppVVar3);
    VmaJsonWriter::WriteNumber(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    in_stack_ffffffffffffff80 =
         (VmaJsonWriter *)
         VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::operator[]
                   ((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_> *)
                    (in_RDI + 0x90),local_30);
    pVVar1 = ((VmaDeviceMemoryBlock *)in_stack_ffffffffffffff80->m_SB)->m_pMetadata;
    (*pVVar1->_vptr_VmaBlockMetadata[0x10])(pVVar1,in_RSI);
    VmaJsonWriter::EndObject(in_stack_ffffffffffffff80);
    local_30 = local_30 + 1;
  }
  VmaJsonWriter::EndObject(in_stack_ffffffffffffff80);
  VmaMutexLockRead::~VmaMutexLockRead((VmaMutexLockRead *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void VmaBlockVector::PrintDetailedMap(class VmaJsonWriter& json)
{
    VmaMutexLockRead lock(m_Mutex, m_hAllocator->m_UseMutex);


    json.BeginObject();
    for (size_t i = 0; i < m_Blocks.size(); ++i)
    {
        json.BeginString();
        json.ContinueString(m_Blocks[i]->GetId());
        json.EndString();

        json.BeginObject();
        json.WriteString("MapRefCount");
        json.WriteNumber(m_Blocks[i]->GetMapRefCount());

        m_Blocks[i]->m_pMetadata->PrintDetailedMap(json);
        json.EndObject();
    }
    json.EndObject();
}